

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O1

void jsons_print_uniques(lyout *out,lys_unique *unique,uint8_t unique_size,int *first)

{
  ulong uVar1;
  byte bVar2;
  undefined7 in_register_00000011;
  char *pcVar3;
  ulong uVar4;
  
  if ((int)CONCAT71(in_register_00000011,unique_size) != 0) {
    pcVar3 = ",";
    if ((first != (int *)0x0) && (pcVar3 = "", *first == 0)) {
      pcVar3 = ",";
    }
    ly_print(out,"%s\"uniques\":[",pcVar3);
    bVar2 = 1;
    if (1 < unique_size) {
      bVar2 = unique_size;
    }
    uVar1 = 0;
    do {
      pcVar3 = ",";
      if (uVar1 == 0) {
        pcVar3 = "";
      }
      ly_print(out,"%s[",pcVar3);
      if (unique[uVar1].expr_size != '\0') {
        uVar4 = 0;
        do {
          pcVar3 = ",";
          if (uVar4 == 0) {
            pcVar3 = "";
          }
          ly_print(out,"%s\"%s\"",pcVar3,unique[uVar1].expr[uVar4]);
          uVar4 = uVar4 + 1;
        } while (uVar4 < unique[uVar1].expr_size);
      }
      ly_print(out,"]");
      uVar1 = uVar1 + 1;
    } while (uVar1 != bVar2);
    ly_print(out,"]");
    if (first != (int *)0x0) {
      *first = 0;
    }
  }
  return;
}

Assistant:

static void
jsons_print_uniques(struct lyout *out, const struct lys_unique *unique, uint8_t unique_size, int *first)
{
    int i, j;

    if (!unique_size) {
        return;
    }

    ly_print(out, "%s\"uniques\":[", (first && (*first)) ? "" : ",");
    for (i = 0; i < unique_size; ++i) {
        ly_print(out, "%s[", i ? "," : "");
        for (j = 0; j < unique[i].expr_size; ++j) {
            ly_print(out, "%s\"%s\"", j ? "," : "", unique[i].expr[j]);
        }
        ly_print(out, "]");
    }
    ly_print(out, "]");
    if (first) {
        (*first) = 0;
    }
}